

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O1

void __thiscall
LongReadsMapper::map_reads
          (LongReadsMapper *this,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *readIDs)

{
  __node_base *__s;
  byte bVar1;
  pointer pLVar2;
  pointer puVar3;
  pointer pvVar4;
  SatKmerIndex *this_00;
  NKmerIndex *this_01;
  size_type sVar5;
  byte *pbVar6;
  ulong uVar7;
  ulong uVar8;
  ostream *poVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  size_type __n;
  vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  *pvVar13;
  LongReadsMapper *this_02;
  ulong uVar14;
  char *s;
  int iVar15;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *threadm;
  ulong uVar16;
  vector<LongReadMapping,std::allocator<LongReadMapping>> *pvVar17;
  vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  read_kmers;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> blocks;
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  thread_mappings;
  shared_ptr<NKmerIndex> nkindex;
  vector<unsigned_char,_std::allocator<unsigned_char>_> candidate_counts;
  shared_ptr<SatKmerIndex> skindex;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  node_matches;
  ReadSequenceBuffer sequenceGetter;
  StreamKmerFactory skf;
  bool local_391;
  key_type_conflict3 local_390;
  allocator_type local_389;
  undefined1 local_388 [8];
  SequenceDistanceGraph *pSStack_380;
  pointer local_378;
  vector<bool,_std::allocator<bool>_> local_368;
  pointer local_340;
  pointer local_338;
  pointer local_330;
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  local_328;
  __shared_ptr<NKmerIndex,_(__gnu_cxx::_Lock_policy)2> local_308;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_2f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2f0;
  __shared_ptr<SatKmerIndex,_(__gnu_cxx::_Lock_policy)2> local_2d8;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  local_2c8;
  vector<LongReadMapping,std::allocator<LongReadMapping>> *local_2a8;
  LongReadsMapper local_2a0;
  undefined1 local_1cf;
  undefined1 local_1cd;
  undefined1 local_1c9;
  undefined1 local_1bc;
  char local_130 [65];
  undefined1 local_ef;
  undefined1 local_ed;
  undefined1 local_e9;
  undefined1 local_dc;
  undefined1 local_cf;
  undefined1 local_cd;
  undefined1 local_c9;
  undefined1 local_bc;
  
  pLVar2 = (this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl
      .super__Vector_impl_data._M_finish != pLVar2) {
    (this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
    super__Vector_impl_data._M_finish = pLVar2;
  }
  local_308._M_ptr = (NKmerIndex *)0x0;
  local_308._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2d8._M_ptr = (SatKmerIndex *)0x0;
  local_2d8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2f8 = readIDs;
  if (this->sat_kmer_index == true) {
    this_00 = (SatKmerIndex *)operator_new(0x38);
    SatKmerIndex::SatKmerIndex(this_00,this->sg,this->k,(uint8_t)this->max_index_freq);
    std::__shared_ptr<SatKmerIndex,_(__gnu_cxx::_Lock_policy)2>::reset<SatKmerIndex>
              (&local_2d8,this_00);
  }
  else {
    this_01 = (NKmerIndex *)operator_new(0x50);
    NKmerIndex::NKmerIndex(this_01,this->sg,this->k,this->max_index_freq);
    std::__shared_ptr<NKmerIndex,_(__gnu_cxx::_Lock_policy)2>::reset<NKmerIndex>(&local_308,this_01)
    ;
  }
  local_328.
  super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.
  super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.
  super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_328.
  super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x18);
  local_328.
  super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((long)local_328.
                       super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 0x18);
  *(undefined8 *)
   ((long)local_328.
          super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start + 0x10) = 0;
  *(undefined8 *)
   local_328.
   super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
   ._M_impl.super__Vector_impl_data._M_start = 0;
  *(undefined8 *)
   ((long)local_328.
          super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start + 8) = 0;
  local_2a0.mappings.super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = this->k;
  __s = &local_2a0.all_paths_between._M_h._M_before_begin;
  local_2a0.all_paths_between._M_h._M_buckets =
       (__buckets_ptr)
       ~(-1L << ((byte)((uint)(byte)local_2a0.mappings.
                                    super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage * 2) & 0x3f))
  ;
  local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a0.all_paths_between._M_h._M_bucket_count =
       (ulong)((uint)(byte)local_2a0.mappings.
                           super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage * 2) - 2;
  local_328.
  super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_328.
       super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_2a8 = (vector<LongReadMapping,std::allocator<LongReadMapping>> *)
              local_328.
              super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  memset(__s,0,0x100);
  local_2a0.all_paths_between._M_h._M_before_begin._M_nxt._0_1_ = 4;
  memset(local_130,0,0x100);
  memset(__s,4,0xff);
  memset(local_130,4,0xff);
  local_2a0.reads_in_node.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_1_ = 0;
  local_1cf = 0;
  local_2a0.reads_in_node.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._3_1_ = 1;
  local_1cd = 1;
  local_2a0.reads_in_node.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._7_1_ = 2;
  local_1c9 = 2;
  local_2a0.reads_in_node.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 3;
  local_1bc = 3;
  local_ef = 3;
  local_cf = 3;
  local_ed = 2;
  local_cd = 2;
  local_e9 = 1;
  local_c9 = 1;
  local_dc = 0;
  local_bc = 0;
  local_378 = (pointer)0x0;
  local_388 = (undefined1  [8])0x0;
  pSStack_380 = (SequenceDistanceGraph *)0x0;
  ReadSequenceBuffer::ReadSequenceBuffer
            ((ReadSequenceBuffer *)&local_2a0,this->datastore,0x1e00000,0x400000);
  local_2c8.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_2f0,
             ((long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x2492492492492492,
             (allocator_type *)&local_368);
  local_390 = 1;
  if ((long)(this->datastore->read_to_fileRecord).
            super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->datastore->read_to_fileRecord).
            super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
            super__Vector_impl_data._M_start == 0x10) {
    local_340 = (pointer)0x0;
    local_338 = (pointer)0x0;
    local_330 = (pointer)0x0;
  }
  else {
    iVar15 = 0;
    local_330 = (pointer)0x0;
    local_338 = (pointer)0x0;
    local_340 = (pointer)0x0;
    do {
      iVar15 = iVar15 + 1;
      if (((uint)(iVar15 * 0x3afb7e91) >> 4 | iVar15 * 0x10000000) < 0x68db9) {
        poVar9 = sdglib::OutputLog(INFO,true);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Thread #",8);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," processing its read #",0x16);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
      }
      if (*(long *)(local_2f8 + 0x18) == 0) {
LAB_001a4547:
        if ((uint)(this->min_size * 2) <=
            (this->datastore->read_to_fileRecord).
            super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
            super__Vector_impl_data._M_start[local_390].record_size) {
          this_02 = &local_2a0;
          pbVar6 = (byte *)ReadSequenceBuffer::get_read_sequence
                                     ((ReadSequenceBuffer *)this_02,(ulong)local_390);
          if ((undefined1  [8])pSStack_380 != local_388) {
            pSStack_380 = (SequenceDistanceGraph *)local_388;
          }
          local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          while( true ) {
            bVar1 = *pbVar6;
            if ((bVar1 == 0) || (bVar1 == 10)) break;
            lVar10 = (long)*(char *)((long)&local_2a0.all_paths_between._M_h._M_before_begin._M_nxt
                                    + (ulong)bVar1);
            if (lVar10 == 4) {
              local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              uVar7 = (long)local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage << 2;
              local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)((3L << ((byte)local_2a0.all_paths_between._M_h._M_bucket_count & 0x3f))
                            + ((ulong)local_2a0.first_mapping.
                                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                      super__Vector_impl_data._M_finish >> 2));
            }
            else {
              uVar7 = lVar10 + (long)local_2a0.first_mapping.
                                     super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage * 4;
              local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)(((long)local_130[bVar1] <<
                             ((byte)local_2a0.all_paths_between._M_h._M_bucket_count & 0x3f)) +
                            ((ulong)local_2a0.first_mapping.
                                    super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                    super__Vector_impl_data._M_finish >> 2));
              local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((long)local_2a0.first_mapping.
                                   super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                   super__Vector_impl_data._M_start + 1);
            }
            local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)(uVar7 & (ulong)local_2a0.all_paths_between._M_h._M_buckets);
            if ((long)(ulong)(byte)local_2a0.mappings.
                                   super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage <=
                (long)local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>.
                      _M_impl.super__Vector_impl_data._M_start) {
              if (local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage <
                  local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                local_368.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                     (_Bit_type *)
                     ((ulong)local_368.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._1_7_
                     << 8);
                this_02 = (LongReadsMapper *)local_388;
                std::
                vector<std::pair<bool,unsigned_long>,std::allocator<std::pair<bool,unsigned_long>>>
                ::emplace_back<bool,unsigned_long&>
                          ((vector<std::pair<bool,unsigned_long>,std::allocator<std::pair<bool,unsigned_long>>>
                            *)this_02,(bool *)&local_368,
                           (unsigned_long *)
                           &local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
              }
              else {
                local_368.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                     (_Bit_type *)
                     CONCAT71(local_368.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._1_7_,
                              1);
                this_02 = (LongReadsMapper *)local_388;
                std::
                vector<std::pair<bool,unsigned_long>,std::allocator<std::pair<bool,unsigned_long>>>
                ::emplace_back<bool,unsigned_long&>
                          ((vector<std::pair<bool,unsigned_long>,std::allocator<std::pair<bool,unsigned_long>>>
                            *)this_02,(bool *)&local_368,
                           (unsigned_long *)
                           &local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>.
                            _M_impl.super__Vector_impl_data._M_finish);
              }
            }
            pbVar6 = pbVar6 + 1;
          }
          __n = (long)pSStack_380 - (long)local_388 >> 4;
          if ((ulong)((long)this->min_size * 2) <= __n) {
            if (this->sat_kmer_index == true) {
              get_sat_kmer_matches
                        (this_02,local_2d8._M_ptr,&local_2c8,
                         (vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                          *)local_388);
            }
            else {
              local_391 = false;
              std::vector<bool,_std::allocator<bool>_>::vector(&local_368,__n,&local_391,&local_389)
              ;
              if ((long)pSStack_380 - (long)local_388 != 0) {
                lVar10 = (long)pSStack_380 - (long)local_388 >> 4;
                uVar14 = (ulong)((local_308._M_ptr)->bfilter).dataSz;
                puVar3 = ((local_308._M_ptr)->bfilter).data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
                pvVar13 = &((DistanceGraph *)local_388)->links;
                uVar7 = 0;
                do {
                  uVar11 = (ulong)(pvVar13->
                                  super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start %
                           ((local_308._M_ptr)->bfilter).estimated_size;
                  uVar8 = uVar7 + 0x3f;
                  if (-1 < (long)uVar7) {
                    uVar8 = uVar7;
                  }
                  lVar12 = (long)uVar8 >> 6;
                  uVar16 = (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001);
                  uVar8 = 1L << ((byte)uVar7 & 0x3f);
                  if ((puVar3[uVar11 / uVar14] >> ((byte)(7 - (char)(uVar11 % uVar14)) & 0x1f) & 1)
                      == 0) {
                    uVar8 = ~uVar8 & local_368.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                     [lVar12 + (uVar16 - 1)];
                  }
                  else {
                    uVar8 = uVar8 | local_368.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                    [lVar12 + (uVar16 - 1)];
                  }
                  local_368.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                  [lVar12 + (uVar16 - 1)] = uVar8;
                  uVar7 = uVar7 + 1;
                  pvVar13 = (vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                             *)&(pvVar13->
                                super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_end_of_storage;
                } while (lVar10 + (ulong)(lVar10 == 0) != uVar7);
              }
              get_all_kmer_matches
                        (this,local_308._M_ptr,&local_2c8,
                         (vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                          *)local_388,&local_368);
              if (local_368.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                  (_Bit_type *)0x0) {
                operator_delete(local_368.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                                (long)local_368.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_end_of_storage -
                                (long)local_368.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                      _M_p);
                local_368.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
                local_368.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
                local_368.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
                local_368.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
                local_368.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
              }
            }
            count_candidates(this,&local_2f0,&local_2c8,
                             (uint32_t)((ulong)((long)pSStack_380 - (long)local_388) >> 4));
            alignment_blocks((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)&local_368
                             ,this,local_390,&local_2c8,
                             (uint32_t)((ulong)((long)pSStack_380 - (long)local_388) >> 4),
                             &local_2f0);
            memset(local_2f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,0,
                   (long)local_2f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_2f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start);
            if (local_368.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p ==
                (_Bit_type *)
                CONCAT44(local_368.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_,
                         local_368.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset)) {
              local_330 = (pointer)((long)local_330 + 1);
            }
            else if ((long)CONCAT44(local_368.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                    _12_4_,local_368.super__Bvector_base<std::allocator<bool>_>.
                                           _M_impl.super__Bvector_impl_data._M_start.
                                           super__Bit_iterator_base._M_offset) -
                     (long)local_368.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p == 0x20)
            {
              local_338 = (pointer)((long)local_338 + 1);
            }
            else {
              local_340 = (pointer)((long)local_340 + 1);
            }
            std::vector<LongReadMapping,std::allocator<LongReadMapping>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<LongReadMapping_const*,std::vector<LongReadMapping,std::allocator<LongReadMapping>>>>
                      (local_2a8,*(undefined8 *)(local_2a8 + 8));
            if (local_368.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0)
            {
              operator_delete(local_368.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                              (long)local_368.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p
                              - (long)local_368.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                      _M_p);
            }
          }
        }
      }
      else {
        sVar5 = std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)local_2f8,&local_390);
        if (sVar5 != 0) goto LAB_001a4547;
      }
      local_390 = local_390 + 1;
    } while ((ulong)local_390 <=
             ((long)(this->datastore->read_to_fileRecord).
                    super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->datastore->read_to_fileRecord).
                    super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
                    super__Vector_impl_data._M_start >> 4) - 1U);
  }
  if ((pointer)local_2f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2f0.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f0.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::~vector(&local_2c8);
  ReadSequenceBuffer::~ReadSequenceBuffer((ReadSequenceBuffer *)&local_2a0);
  if (local_388 != (undefined1  [8])0x0) {
    operator_delete((void *)local_388,(long)local_378 - (long)local_388);
  }
  poVar9 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Read results:    ",0x11);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," no match    ",0xd);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," single match    ",0x11);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," multi matches",0xe);
  std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  pvVar4 = local_328.
           super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_328.
      super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_328.
      super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar17 = (vector<LongReadMapping,std::allocator<LongReadMapping>> *)
              local_328.
              super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::vector<LongReadMapping,std::allocator<LongReadMapping>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<LongReadMapping*,std::vector<LongReadMapping,std::allocator<LongReadMapping>>>>
                ((vector<LongReadMapping,std::allocator<LongReadMapping>> *)&this->mappings,
                 (this->mappings).
                 super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
                 super__Vector_impl_data._M_finish,*(undefined8 *)pvVar17,
                 *(undefined8 *)(pvVar17 + 8));
      pvVar17 = pvVar17 + 0x18;
    } while (pvVar17 != (vector<LongReadMapping,std::allocator<LongReadMapping>> *)pvVar4);
  }
  poVar9 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Updating mapping indexes",0x18);
  std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  update_indexes(this);
  std::
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ::~vector(&local_328);
  if (local_2d8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2d8._M_refcount._M_pi);
  }
  if (local_308._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_308._M_refcount._M_pi);
  }
  return;
}

Assistant:

void LongReadsMapper::map_reads(const std::unordered_set<uint32_t> &readIDs) {
    mappings.clear();
    std::shared_ptr<NKmerIndex> nkindex;
    std::shared_ptr<SatKmerIndex> skindex;
    if (sat_kmer_index) skindex.reset(new SatKmerIndex(sg,k,max_index_freq));
    else nkindex.reset(new NKmerIndex(sg,k,max_index_freq));
    std::vector<std::vector<LongReadMapping>> thread_mappings(omp_get_max_threads());
    uint32_t num_reads_done(0);
    uint64_t no_matches(0),single_matches(0),multi_matches(0);
#pragma omp parallel
    {
        StreamKmerFactory skf(k);
        std::vector<std::pair<bool, uint64_t>> read_kmers;

        auto & private_results=thread_mappings[omp_get_thread_num()];
        ReadSequenceBuffer sequenceGetter(datastore);
        std::vector<std::vector<std::pair<int32_t, int32_t>>> node_matches; //node, offset
        const char * query_sequence_ptr;

        std::vector<unsigned char> candidate_counts(sg.nodes.size()*2);

#pragma omp for schedule(static,1000) reduction(+:no_matches,single_matches,multi_matches,num_reads_done)
        for (uint32_t readID = 1; readID <= datastore.size(); ++readID) {
            if (++num_reads_done%10000 == 0) {
                sdglib::OutputLog() << "Thread #"<<omp_get_thread_num() <<" processing its read #" << num_reads_done << std::endl;
            }

            if ((!readIDs.empty() and readIDs.count(readID)==0 /*Read not in selected set*/)) {
                continue;
            }
            if (datastore.read_to_fileRecord[readID].record_size< 2 * min_size ) continue;
            //========== 1. Get read sequence, kmerise, get all matches ==========
            query_sequence_ptr = sequenceGetter.get_read_sequence(readID);
            read_kmers.clear();
            skf.produce_all_kmers(query_sequence_ptr, read_kmers);

            if ( read_kmers.size()< 2 * min_size) {
                continue;
            }

            if (sat_kmer_index) {
                get_sat_kmer_matches(*skindex,node_matches, read_kmers);
            } else {
                std::vector<bool> kmer_in_assembly(read_kmers.size());

                for (uint64_t i = 0; i < read_kmers.size(); ++i) {
                    kmer_in_assembly[i] = nkindex->filter(read_kmers[i].second);
                }
                get_all_kmer_matches(*nkindex, node_matches, read_kmers, kmer_in_assembly);
            }

            //========== 2. Find match candidates in fixed windows ==========

            count_candidates(candidate_counts, node_matches,read_kmers.size());

            //========== 3. Create alignment blocks from candidates ==========

            auto blocks(alignment_blocks(readID,node_matches,read_kmers.size(), candidate_counts));
            std::memset(candidate_counts.data(), 0, candidate_counts.size());

            //========== 4. Construct mapping path ==========
            if (blocks.empty()) ++no_matches;
            else if (blocks.size()==1) ++single_matches;
            else ++multi_matches;
            //TODO: align blocks that occupy the same space as longer/better blocks should be thrown away.

            //auto fblocks=filter_blocks(blocks,node_matches,read_kmers.size());
            const auto &fblocks = blocks;

//            std::cout<<"READ " << readID << " mappings, after FILTERING:"<<std::endl;
//            for (auto b:fblocks)
//                std::cout << "READ\tTarget: " << b.node << " (" << sdg.nodes[llabs(b.node)].sequence.size() << " bp)  "
//                          << b.qStart << ":" << b.qEnd << " -> " << b.nStart << ":" << b.nEnd
//                          << " (" << b.score << " chained hits, " << b.qEnd - b.qStart + k << "bp, "
//                          << b.score * 100 / (b.qEnd - b.qStart) << "%)"
//                          << std::endl;

            private_results.insert(private_results.end(),fblocks.begin(),fblocks.end());
        }
    }
    //TODO: report read and win coverage by winners vs. by loosers
//    sdglib::OutputLog()<<"Read window results:    "<<window_low_score<<" low score    "<<window_close_second<<" close second    "<<window_hit<<" hits"<<std::endl;
    sdglib::OutputLog()<<"Read results:    "<<no_matches<<" no match    "<<single_matches<<" single match    "<<multi_matches<<" multi matches"<<std::endl;
    for (auto & threadm : thread_mappings) {
        mappings.insert(mappings.end(),threadm.begin(),threadm.end());
    }
    sdglib::OutputLog() << "Updating mapping indexes" <<std::endl;
    update_indexes();
}